

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

Vec_Int_t * Gia_ManBfsForCrossCut(Gia_Man_t *p)

{
  int Entry;
  Vec_Int_t *p_00;
  Vec_Vec_t *p_01;
  Vec_Ptr_t *pVVar1;
  Gia_Obj_t *pObj;
  int i;
  int iVar2;
  int iVar3;
  
  p_00 = Vec_IntAlloc(p->nObjs);
  p_01 = Gia_ManLevelize(p);
  for (iVar2 = 0; iVar3 = p_01->nSize, iVar2 < iVar3; iVar2 = iVar2 + 1) {
    pVVar1 = Vec_VecEntry(p_01,iVar2);
    for (iVar3 = 0; iVar3 < pVVar1->nSize; iVar3 = iVar3 + 1) {
      pObj = (Gia_Obj_t *)Vec_PtrEntry(pVVar1,iVar3);
      Entry = Gia_ObjId(p,pObj);
      Vec_IntPush(p_00,Entry);
    }
  }
  for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
    pVVar1 = Vec_VecEntry(p_01,iVar2);
    if (pVVar1 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(pVVar1);
    }
    iVar3 = p_01->nSize;
  }
  Vec_PtrFree((Vec_Ptr_t *)p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManBfsForCrossCut( Gia_Man_t * p )
{
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Vec_Vec_t * vLevels = Gia_ManLevelize( p );
    Vec_Ptr_t * vObjs;
    Gia_Obj_t * pObj;
    int i, k;
    Vec_VecForEachLevel( vLevels, vObjs, i )
        Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, k )
            Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    Vec_VecFree( vLevels );
    return vNodes;
}